

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxLexer.cpp
# Opt level: O2

void __thiscall Jinx::Impl::Lexer::ParseNumber(Lexer *this)

{
  byte bVar1;
  byte *ptr;
  bool bVar2;
  long lVar3;
  uint uVar4;
  char *pcVar5;
  Lexer *this_00;
  double number;
  double local_50;
  String local_48;
  
  pcVar5 = this->m_current;
  uVar4 = (uint)(*pcVar5 == '.');
  while( true ) {
    this_00 = this;
    AdvanceCurrent(this);
    ptr = (byte *)this->m_current;
    bVar1 = *ptr;
    if ((bVar1 == 0) || (this->m_end < ptr)) goto LAB_001c859e;
    if (bVar1 != 0x2e && 9 < bVar1 - 0x30) break;
    uVar4 = uVar4 + (bVar1 == 0x2e);
  }
  bVar2 = IsName(this_00,(char *)ptr);
  if (bVar2) {
    Error<>(this,"Invalid number format");
  }
LAB_001c859e:
  if (uVar4 < 2) {
    if (uVar4 == 0) {
      local_50 = 0.0;
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      std::__cxx11::basic_string<char,std::char_traits<char>,Jinx::Allocator<char>>::
      _M_construct<char_const*>
                ((basic_string<char,std::char_traits<char>,Jinx::Allocator<char>> *)&local_48,pcVar5
                 ,this->m_current);
      bVar2 = StringToInteger(&local_48,(int64_t *)&local_50);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
      ~basic_string(&local_48);
      if (bVar2) {
        CreateSymbol(this,(int64_t)local_50);
        return;
      }
      pcVar5 = "Invalid integer format: unable to convert string to integer";
    }
    else {
      lVar3 = (long)this->m_current - (long)pcVar5;
      if (lVar3 < 2) {
        pcVar5 = "Invalid number format: no digits after decimal place";
        goto LAB_001c85c4;
      }
      local_50 = 0.0;
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      std::__cxx11::basic_string<char,std::char_traits<char>,Jinx::Allocator<char>>::
      _M_construct<char_const*>
                ((basic_string<char,std::char_traits<char>,Jinx::Allocator<char>> *)&local_48,pcVar5
                 ,pcVar5 + lVar3);
      bVar2 = StringToNumber(&local_48,&local_50,International);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
      ~basic_string(&local_48);
      if (bVar2) {
        CreateSymbol(this,local_50);
        return;
      }
      pcVar5 = "Invalid number format: unable to convert string to double";
    }
    Error<>(this,pcVar5);
    return;
  }
  pcVar5 = "Invalid number format: too many decimal places";
LAB_001c85c4:
  Error<>(this,pcVar5);
  return;
}

Assistant:

inline_t void Lexer::ParseNumber()
	{
		const char * startNum = m_current;
		int points = 0;
		if (*startNum == '.')
			points = 1;
		AdvanceCurrent();
		while (!IsEndOfText())
		{
			char c = *m_current;
			if (!IsNumber(c))
			{
				if (IsName(m_current))
				{
					Error("Invalid number format");
					break;
				}
				else
				{
					break;
				}
			}
			if (c == '.')
				++points;
			AdvanceCurrent();
		}
		if (points > 1)
			Error("Invalid number format: too many decimal places");
		else if (points == 0)
		{
			int64_t integer = 0;
			if (!StringToInteger(String(startNum, m_current - startNum), &integer))
			{
				Error("Invalid integer format: unable to convert string to integer");
				return;
			}
			CreateSymbol(integer);
		}
		else
		{
			if (m_current - startNum <= 1)
			{
				Error("Invalid number format: no digits after decimal place");
				return;
			}
			double number = 0.0f;
			if (!StringToNumber(String(startNum, m_current - startNum), &number))
			{
				Error("Invalid number format: unable to convert string to double");
				return;
			}
			CreateSymbol(number);
		}
	}